

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::Output(Node *this,ostream *os)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  cVar1 = (char)os;
  if (NeedIostreamH != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <iostream>",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <limits>",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <array>",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedIostreamH = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"#include <cstdlib>",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"#include <cstring>",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  NeedStdlibH = 0;
  std::__ostream_insert<char,std::char_traits<char>>(os,"#include <unistd.h>",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  NeedUnistd = 0;
  if (NeedMathH != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <cmath>",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedMathH = 0;
  }
  if (NeedErrorH != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <cerrno>",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedErrorH = 0;
  }
  if (NeedTimeH != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include <ctime>",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedTimeH = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"#include \"basicfun.h\"",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"#include \"basicchannel.h\"",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  NeedChannel = 0;
  NeedBasicFun = 0;
  if (NeedDataList != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include \"datalist.h\"",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedDataList = 0;
  }
  if (NeedPuse != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include \"pusing.h\"",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  if (NeedVirtual != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#include \"virtual.h\"",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedVirtual = 0;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (NeedRFA != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"typedef char RmsRfa[6];",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedRFA = 0;
  }
  if (NeedPuse != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"static basic::PUsing PUse;\t// Needed for print using",0x34);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    NeedPuse = 0;
  }
  iVar3 = 0;
  if (0 < Level) {
    iVar3 = Level;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"extern basic::BasicError Be;",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  ListOfVariables::OutputDef
            ((Variables->super_vector<ListOfVariables,_std::allocator<ListOfVariables>_>).
             super__Vector_base<ListOfVariables,_std::allocator<ListOfVariables>_>._M_impl.
             super__Vector_impl_data._M_finish + -1,os,Level);
  OutputPrototypes(this,os);
  Level = 0;
  OutputCode(this,os);
  return;
}

Assistant:

void Node::Output(
	std::ostream& os	/**< Stream to write C++ code to */
)
{
	//
	// Handle Include Files
	//
	if (NeedIostreamH != 0)
	{
		os << "#include <iostream>" << std::endl;
		os << "#include <limits>" << std::endl;
		os << "#include <array>" << std::endl;
		NeedIostreamH = 0;
	}

	os << "#include <cstdlib>" << std::endl;
	os << "#include <cstring>" << std::endl;
	NeedStdlibH = 0;

	os << "#include <unistd.h>" << std::endl;
	NeedUnistd = 0;

	if (NeedMathH != 0)
	{
		os << "#include <cmath>" << std::endl;
		NeedMathH = 0;
	}

	if (NeedErrorH != 0)
	{
		os << "#include <cerrno>" << std::endl;
		NeedErrorH = 0;
	}

	if (NeedTimeH != 0)
	{
		os << "#include <ctime>" << std::endl;
		NeedTimeH = 0;
	}

	os << "#include \"basicfun.h\"" << std::endl;
	os << "#include \"basicchannel.h\"" << std::endl;

	NeedChannel = 0;
	NeedBasicFun = 0;

	if (NeedDataList != 0)
	{
		os << "#include \"datalist.h\"" << std::endl;
		NeedDataList = 0;
	}

	if (NeedPuse != 0)
	{
		os << "#include \"pusing.h\"" << std::endl;
	}

	if (NeedVirtual != 0)
	{
		os << "#include \"virtual.h\"" << std::endl;
		NeedVirtual = 0;
	}

	os << std::endl;

	if (NeedRFA != 0)
	{
		os << "typedef char RmsRfa[6];" << std::endl;
		NeedRFA = 0;
	}

	if (NeedPuse != 0)
	{
		os << "static basic::PUsing PUse;\t// Needed for print using" << std::endl;
		NeedPuse = 0;
	}

	//
	// This code duplicates basicfun.h, but sometimes it is still needed
	// 
	os << Indent() << "extern basic::BasicError Be;" <<
		std::endl;

	os << std::endl;

	//
	// Output the variables
	//
	Variables->OutputDef(os, Level);

	//
	// Dump out prototypes
	//
	OutputPrototypes(os);

	//
	// Output code
	//
	Level = 0;
	OutputCode(os);
}